

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

void nni_http_handler_set_host(nni_http_handler *h,char *host)

{
  uint16_t uVar1;
  _Bool _Var2;
  int iVar3;
  undefined1 auVar4 [16];
  uint8_t wild [16];
  
  _Var2 = nni_atomic_get_bool(&h->busy);
  if (_Var2) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server.c"
              ,0xb9,"!nni_atomic_get_bool(&h->busy)");
  }
  if (host != (char *)0x0) {
    iVar3 = strcmp(host,"*");
    if ((iVar3 != 0) && (*host != '\0')) {
      iVar3 = nni_parse_ip(host,&h->host_addr);
      if (iVar3 == 0) {
        uVar1 = (h->host_addr).s_family;
        if (uVar1 == 4) {
          auVar4[0] = -((h->host_addr).s_ipc.sa_path[2] == '\0');
          auVar4[1] = -((h->host_addr).s_ipc.sa_path[3] == '\0');
          auVar4[2] = -((h->host_addr).s_ipc.sa_path[4] == '\0');
          auVar4[3] = -((h->host_addr).s_ipc.sa_path[5] == '\0');
          auVar4[4] = -((h->host_addr).s_ipc.sa_path[6] == '\0');
          auVar4[5] = -((h->host_addr).s_ipc.sa_path[7] == '\0');
          auVar4[6] = -((h->host_addr).s_ipc.sa_path[8] == '\0');
          auVar4[7] = -((h->host_addr).s_ipc.sa_path[9] == '\0');
          auVar4[8] = -((h->host_addr).s_ipc.sa_path[10] == '\0');
          auVar4[9] = -((h->host_addr).s_ipc.sa_path[0xb] == '\0');
          auVar4[10] = -((h->host_addr).s_ipc.sa_path[0xc] == '\0');
          auVar4[0xb] = -((h->host_addr).s_ipc.sa_path[0xd] == '\0');
          auVar4[0xc] = -((h->host_addr).s_ipc.sa_path[0xe] == '\0');
          auVar4[0xd] = -((h->host_addr).s_ipc.sa_path[0xf] == '\0');
          auVar4[0xe] = -((h->host_addr).s_ipc.sa_path[0x10] == '\0');
          auVar4[0xf] = -((h->host_addr).s_ipc.sa_path[0x11] == '\0');
          if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar4[0xf] >> 7) << 0xf) == 0xffff) goto LAB_00135cd2;
        }
        else if ((uVar1 == 3) && ((h->host_addr).s_in.sa_addr == 0)) goto LAB_00135cd2;
        h->host_ip = true;
      }
      snprintf(h->host,0x100,"%s",host);
      return;
    }
  }
LAB_00135cd2:
  h->host[0] = '\0';
  return;
}

Assistant:

void
nni_http_handler_set_host(nni_http_handler *h, const char *host)
{
	NNI_ASSERT(!nni_atomic_get_bool(&h->busy));

	if ((host == NULL) || (strcmp(host, "*") == 0) ||
	    strcmp(host, "") == 0) {
		(void) strcpy(h->host, "");
		return;
	}
	if (nni_parse_ip(host, &h->host_addr) == 0) {
		uint8_t wild[16] = { 0 };

		// Check for wild card addresses.
		switch (h->host_addr.s_family) {
		case NNG_AF_INET:
			if (h->host_addr.s_in.sa_addr == 0) {
				(void) strcpy(h->host, "");
				return;
			}
			break;
		case NNG_AF_INET6:
			if (memcmp(h->host_addr.s_in6.sa_addr, wild, 16) ==
			    0) {
				(void) strcpy(h->host, "");
				return;
			}
			break;
		}
		h->host_ip = true;
	}
	(void) snprintf(h->host, sizeof(h->host), "%s", host);
}